

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

LinkIndex __thiscall
iDynTree::Traversal::getChildLinkIndexFromJointIndex(Traversal *this,Model *model,JointIndex jntIdx)

{
  bool bVar1;
  int iVar2;
  Traversal *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JointIndex in_RDI;
  LinkIndex childLink;
  LinkIndex link2;
  LinkIndex link1;
  IJointConstPtr jnt;
  Model *in_stack_ffffffffffffffc0;
  LinkIndex local_8;
  LinkIndex parentCandidate;
  
  this_00 = (Traversal *)Model::getJoint(in_stack_ffffffffffffffc0,in_RDI);
  if (this_00 == (Traversal *)0x0) {
    local_8 = LINK_INVALID_INDEX;
  }
  else {
    iVar2 = (*(code *)(this_00->links).
                      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[7])();
    parentCandidate = CONCAT44(extraout_var,iVar2);
    iVar2 = (*(code *)(this_00->links).
                      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[8])();
    local_8 = CONCAT44(extraout_var_00,iVar2);
    bVar1 = isParentOf(this_00,parentCandidate,local_8);
    if (!bVar1) {
      local_8 = parentCandidate;
    }
  }
  return local_8;
}

Assistant:

LinkIndex Traversal::getChildLinkIndexFromJointIndex(const Model& model, const JointIndex jntIdx) const
{
    // Get the two links connected by this joint
    IJointConstPtr jnt = model.getJoint(jntIdx);
    if (!jnt)
    {
        return LINK_INVALID_INDEX;
    }

    LinkIndex link1 = jnt->getFirstAttachedLink();
    LinkIndex link2 = jnt->getSecondAttachedLink();

    // Get the traversal index of the child link (according to the traversal)
    LinkIndex childLink;
    if( this->isParentOf(link1,link2) )
    {
        childLink = link2;
    }
    else
    {
        childLink = link1;
    }

    return childLink;
}